

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecatDemoCommon.cpp
# Opt level: O0

EC_T_DWORD
CoeReadObjectDictionary
          (EC_T_DWORD dwInstanceID,CAtEmLogging *poLog,EC_T_INT nVerbosePrinting,
          EC_T_BOOL *pbStopReading,EC_T_DWORD dwClientId,EC_T_DWORD dwNodeId,
          EC_T_BOOL bPerformUpload,EC_T_DWORD dwTimeout)

{
  ushort uVar1;
  byte bVar2;
  EC_T_WORD EVar3;
  EC_T_DWORD EVar4;
  EC_T_DWORD EVar5;
  uint uVar6;
  size_t sVar7;
  size_t sVar8;
  undefined8 uVar9;
  EC_T_UINT64 EVar10;
  EC_T_UINT64 EVar11;
  bool bVar12;
  bool bVar13;
  char *in_stack_fffffffffffffaa8;
  undefined4 uVar14;
  undefined1 *in_stack_fffffffffffffab0;
  undefined4 uVar15;
  EC_T_CHAR *in_stack_fffffffffffffab8;
  undefined4 uVar16;
  EC_T_CHAR *in_stack_fffffffffffffac0;
  char *local_500;
  char *local_4f8;
  char *local_4f0;
  uint local_480;
  int local_464;
  uint local_448;
  uint local_43c;
  EC_T_BOOL bEntryValid;
  EC_T_DWORD dwIdx;
  EC_T_OBJ10F3_DIAGMSG *pDiag;
  undefined4 local_428;
  EC_T_DWORD dwUploadBytes;
  EC_T_BYTE abySDOValue [512];
  EC_T_BYTE *pbyMaxValue;
  EC_T_BYTE *pbyMinValue;
  EC_T_BYTE *pbyDefaultValue;
  undefined1 local_208 [4];
  EC_T_DWORD dwUnitType;
  EC_T_CHAR szDescription [50];
  EC_T_CHAR szMaxValue [10];
  EC_T_CHAR szMinValue [10];
  EC_T_CHAR szDefaultValue [10];
  EC_T_CHAR szUnitType [10];
  EC_T_INT nDataIdx;
  EC_T_CHAR szPdoMapInfo [50];
  undefined1 local_168;
  undefined1 uStack_167;
  undefined1 uStack_166;
  undefined1 uStack_165;
  EC_T_INT nAccessIdx;
  EC_T_CHAR szAccess [50];
  char local_128 [8];
  EC_T_CHAR szObName [100];
  ushort local_b4;
  ushort local_b2;
  EC_T_WORD wNameLen;
  EC_T_WORD wSubIndex;
  EC_T_WORD wSubIndexLimit;
  EC_T_BOOL bReadingMasterOD;
  EC_T_DWORD dwUniqueTransferId;
  EC_T_BYTE byValueInfoType;
  EC_T_WORD wIndex;
  void *pvStack_a0;
  EC_T_WORD wODListLen;
  EC_T_WORD *pwODList;
  EC_T_MBXTFER *pMbxGetEntryDescTfer;
  EC_T_MBXTFER *pMbxGetObDescTfer;
  EC_T_MBXTFER *pMbxGetODLTfer;
  undefined1 auStack_78 [4];
  EC_T_MBXTFER_DESC MbxTferDesc;
  EC_T_BYTE *pbyGetEntryTferBuffer;
  EC_T_BYTE *pbyOBDescTferBuffer;
  EC_T_BYTE *pbyODLTferBuffer;
  EC_T_DWORD dwRes;
  EC_T_DWORD dwRetVal;
  EC_T_DWORD dwNodeId_local;
  EC_T_DWORD dwClientId_local;
  EC_T_BOOL *pbStopReading_local;
  EC_T_INT nVerbosePrinting_local;
  CAtEmLogging *poLog_local;
  EC_T_DWORD dwInstanceID_local;
  
  local_428 = CONCAT13(local_428._3_1_,
                       CONCAT12(local_428._2_1_,CONCAT11(local_428._1_1_,(byte)local_428)));
  pbyOBDescTferBuffer = (EC_T_BYTE *)0x0;
  pbyGetEntryTferBuffer = (EC_T_BYTE *)0x0;
  MbxTferDesc.pbyMbxTferDescData = (EC_T_BYTE *)0x0;
  memset((void *)((long)&pMbxGetODLTfer + 4),0,0xc);
  pMbxGetObDescTfer = (EC_T_MBXTFER *)0x0;
  pMbxGetEntryDescTfer = (EC_T_MBXTFER *)0x0;
  pwODList = (EC_T_WORD *)0x0;
  pvStack_a0 = (void *)0x0;
  if (((poLog == (CAtEmLogging *)0x0) || (pbStopReading == (EC_T_BOOL *)0x0)) || (dwTimeout == 0)) {
    pbyODLTferBuffer._4_4_ = 0x9811000b;
    EVar4 = pbyODLTferBuffer._4_4_;
  }
  else {
    pbyOBDescTferBuffer = (EC_T_BYTE *)malloc(0x1200);
    pbyGetEntryTferBuffer = (EC_T_BYTE *)malloc(100);
    MbxTferDesc.pbyMbxTferDescData = (EC_T_BYTE *)malloc(100);
    if (((pbyOBDescTferBuffer == (EC_T_BYTE *)0x0) || (pbyGetEntryTferBuffer == (EC_T_BYTE *)0x0))
       || (MbxTferDesc.pbyMbxTferDescData == (EC_T_BYTE *)0x0)) {
      pbyODLTferBuffer._4_4_ = 0x9811000a;
      EVar4 = pbyODLTferBuffer._4_4_;
    }
    else {
      memset(pbyOBDescTferBuffer,0,0x1200);
      memset(pbyGetEntryTferBuffer,0,100);
      memset(MbxTferDesc.pbyMbxTferDescData,0,100);
      pMbxGetODLTfer._4_4_ = 0x1200;
      _auStack_78 = pbyOBDescTferBuffer;
      pMbxGetObDescTfer = (EC_T_MBXTFER *)emMbxTferCreate(dwInstanceID,(long)&pMbxGetODLTfer + 4);
      if (pMbxGetObDescTfer == (EC_T_MBXTFER *)0x0) {
        pbyODLTferBuffer._4_4_ = 0x9811000a;
        EVar4 = pbyODLTferBuffer._4_4_;
      }
      else {
        pMbxGetODLTfer._4_4_ = 100;
        _auStack_78 = pbyGetEntryTferBuffer;
        pMbxGetEntryDescTfer =
             (EC_T_MBXTFER *)emMbxTferCreate(dwInstanceID,(long)&pMbxGetODLTfer + 4);
        if (pMbxGetEntryDescTfer == (EC_T_MBXTFER *)0x0) {
          pbyODLTferBuffer._4_4_ = 0x9811000a;
          EVar4 = pbyODLTferBuffer._4_4_;
        }
        else {
          pMbxGetODLTfer._4_4_ = 100;
          _auStack_78 = MbxTferDesc.pbyMbxTferDescData;
          pwODList = (EC_T_WORD *)emMbxTferCreate(dwInstanceID,(long)&pMbxGetODLTfer + 4);
          if ((EC_T_MBXTFER *)pwODList == (EC_T_MBXTFER *)0x0) {
            pbyODLTferBuffer._4_4_ = 0x9811000a;
            EVar4 = pbyODLTferBuffer._4_4_;
          }
          else {
            pMbxGetObDescTfer->dwClntId = dwClientId;
            pMbxGetObDescTfer->dwTferId = 0;
            pMbxGetObDescTfer->dwDataLen = (pMbxGetObDescTfer->MbxTferDesc).dwMaxDataLen;
            EVar4 = emCoeGetODList(dwInstanceID,pMbxGetObDescTfer,dwNodeId,1,dwTimeout);
            if ((EVar4 != 0x9811010e) &&
               (HandleMbxTferReqError
                          (poLog,"CoeReadObjectDictionary: Error in emCoeGetODList(ALL)",EVar4,
                           pMbxGetObDescTfer), EVar4 == 0)) {
              pvStack_a0 = malloc((ulong)(pMbxGetObDescTfer->MbxData).CoE_ODList.wLen << 1);
              if (pvStack_a0 == (void *)0x0) {
                pbyODLTferBuffer._4_4_ = 0x9811000a;
                EVar4 = pbyODLTferBuffer._4_4_;
              }
              else {
                memset(pvStack_a0,0,(ulong)(pMbxGetObDescTfer->MbxData).CoE_ODList.wLen << 1);
                bVar12 = dwNodeId == 0x10000;
                if (1 < nVerbosePrinting) {
                  CAtEmLogging::LogMsg(poLog,"Complete OD list:");
                }
                dwUniqueTransferId._2_2_ = 0;
                for (dwUniqueTransferId._0_2_ = 0;
                    (ushort)dwUniqueTransferId < (pMbxGetObDescTfer->MbxData).CoE_ODList.wLen;
                    dwUniqueTransferId._0_2_ = (ushort)dwUniqueTransferId + 1) {
                  *(EC_T_WORD *)((long)pvStack_a0 + (ulong)dwUniqueTransferId._2_2_ * 2) =
                       (pMbxGetObDescTfer->MbxData).CoE_ODList.pwOdList[(ushort)dwUniqueTransferId];
                  if ((1 < nVerbosePrinting) &&
                     (CAtEmLogging::LogMsgAdd
                                (poLog,"%04X ",
                                 (ulong)*(ushort *)
                                         ((long)pvStack_a0 + (ulong)dwUniqueTransferId._2_2_ * 2)),
                     ((ushort)dwUniqueTransferId + 1) % 10 == 0)) {
                    CAtEmLogging::LogMsg(poLog,"");
                  }
                  if (*(short *)((long)pvStack_a0 + (ulong)dwUniqueTransferId._2_2_ * 2) != 0) {
                    dwUniqueTransferId._2_2_ = dwUniqueTransferId._2_2_ + 1;
                  }
                }
                if (1 < nVerbosePrinting) {
                  CAtEmLogging::LogMsg(poLog,"");
                  LinuxSleep(2);
                }
                pMbxGetObDescTfer->eTferStatus = eMbxTferStatus_Idle;
                pMbxGetObDescTfer->dwClntId = dwClientId;
                pMbxGetObDescTfer->dwTferId = 1;
                pMbxGetObDescTfer->dwDataLen = (pMbxGetObDescTfer->MbxTferDesc).dwMaxDataLen;
                EVar4 = emCoeGetODList(dwInstanceID,pMbxGetObDescTfer,dwNodeId,2,dwTimeout);
                if ((EVar4 != 0x9811010e) &&
                   (HandleMbxTferReqError
                              (poLog,"CoeReadObjectDictionary: Error in emCoeGetODList(RxPdoMap)",
                               EVar4,pMbxGetObDescTfer), EVar4 == 0)) {
                  if (1 < nVerbosePrinting) {
                    CAtEmLogging::LogMsg(poLog,"RX PDO Mappable Objects:");
                    for (dwUniqueTransferId._0_2_ = 0;
                        (ushort)dwUniqueTransferId < (pMbxGetObDescTfer->MbxData).CoE_ODList.wLen;
                        dwUniqueTransferId._0_2_ = (ushort)dwUniqueTransferId + 1) {
                      CAtEmLogging::LogMsgAdd
                                (poLog,"%04X ",
                                 (ulong)(pMbxGetObDescTfer->MbxData).CoE_ODList.pwOdList
                                        [(ushort)dwUniqueTransferId]);
                      if (((ushort)dwUniqueTransferId + 1) % 10 == 0) {
                        CAtEmLogging::LogMsg(poLog,"");
                      }
                    }
                    CAtEmLogging::LogMsg(poLog,"");
                  }
                  pMbxGetObDescTfer->eTferStatus = eMbxTferStatus_Idle;
                  pMbxGetObDescTfer->dwClntId = dwClientId;
                  _wSubIndex = 3;
                  pMbxGetObDescTfer->dwTferId = 2;
                  pMbxGetObDescTfer->dwDataLen = (pMbxGetObDescTfer->MbxTferDesc).dwMaxDataLen;
                  EVar4 = emCoeGetODList(dwInstanceID,pMbxGetObDescTfer,dwNodeId,3,dwTimeout);
                  if ((EVar4 != 0x9811010e) &&
                     (HandleMbxTferReqError
                                (poLog,"CoeReadObjectDictionary: Error in emCoeGetODList(TxPdoMap)",
                                 EVar4,pMbxGetObDescTfer), EVar4 == 0)) {
                    if (1 < nVerbosePrinting) {
                      CAtEmLogging::LogMsg(poLog,"TX PDO Mappable Objects:");
                      for (dwUniqueTransferId._0_2_ = 0;
                          (ushort)dwUniqueTransferId < (pMbxGetObDescTfer->MbxData).CoE_ODList.wLen;
                          dwUniqueTransferId._0_2_ = (ushort)dwUniqueTransferId + 1) {
                        CAtEmLogging::LogMsgAdd
                                  (poLog,"%04X ",
                                   (ulong)(pMbxGetObDescTfer->MbxData).CoE_ODList.pwOdList
                                          [(ushort)dwUniqueTransferId]);
                        if (((ushort)dwUniqueTransferId + 1) % 10 == 0) {
                          CAtEmLogging::LogMsg(poLog,"");
                        }
                      }
                      CAtEmLogging::LogMsg(poLog,"");
                    }
                    pMbxGetObDescTfer->eTferStatus = eMbxTferStatus_Idle;
                    if (1 < nVerbosePrinting) {
                      CAtEmLogging::LogMsg(poLog,"");
                      CAtEmLogging::LogMsg
                                (poLog,
                                 "*************************************************************");
                      CAtEmLogging::LogMsg
                                (poLog,
                                 "****                  OBJECT DESCRIPTION                 ****");
                      CAtEmLogging::LogMsg
                                (poLog,
                                 "*************************************************************");
                    }
                    pbyODLTferBuffer._4_4_ = 0;
                    dwUniqueTransferId._0_2_ = 0;
                    while( true ) {
                      bVar13 = false;
                      if (((ushort)dwUniqueTransferId < dwUniqueTransferId._2_2_) &&
                         (bVar13 = false, pbyODLTferBuffer._4_4_ == 0)) {
                        bVar13 = *pbStopReading == 0;
                      }
                      if (!bVar13) break;
                      pMbxGetEntryDescTfer->dwClntId = dwClientId;
                      pMbxGetEntryDescTfer->dwDataLen =
                           (pMbxGetEntryDescTfer->MbxTferDesc).dwMaxDataLen;
                      pMbxGetEntryDescTfer->dwTferId = _wSubIndex;
                      EVar4 = emCoeGetObjectDesc(dwInstanceID,pMbxGetEntryDescTfer,dwNodeId,
                                                 *(undefined2 *)
                                                  ((long)pvStack_a0 +
                                                  (ulong)(ushort)dwUniqueTransferId * 2),dwTimeout);
                      if (EVar4 == 0x9811010e) goto LAB_00153825;
                      HandleMbxTferReqError
                                (poLog,"CoeReadObjectDictionary: Error in emCoeGetObjectDesc",EVar4,
                                 pMbxGetObDescTfer);
                      uVar14 = (undefined4)((ulong)in_stack_fffffffffffffab0 >> 0x20);
                      if (EVar4 != 0) goto LAB_00153825;
                      if (1 < nVerbosePrinting) {
                        memset(local_128,0,100);
                        uVar1 = (pMbxGetEntryDescTfer->MbxData).CoE_ObDesc.wObNameLen;
                        if (uVar1 < 99) {
                          local_448 = (uint)uVar1;
                        }
                        else {
                          local_448 = 99;
                        }
                        strncpy(local_128,(pMbxGetEntryDescTfer->MbxData).CoE_ObDesc.pchObName,
                                (long)(int)local_448);
                        local_128[(ushort)local_448] = '\0';
                        in_stack_fffffffffffffaa8 = "mandatory";
                        if ((pMbxGetEntryDescTfer->MbxData).CoE_ObDesc.byObjCategory == '\0') {
                          in_stack_fffffffffffffaa8 = "optional";
                        }
                        in_stack_fffffffffffffab0 =
                             (undefined1 *)
                             CONCAT44(uVar14,(uint)(pMbxGetEntryDescTfer->MbxData).CoE_ObDesc.
                                                   byMaxNumSubIndex);
                        CAtEmLogging::LogMsg
                                  (poLog,"%04x %s: type 0x%04x, code=0x%02x, %s, SubIds=%d",
                                   (ulong)(pMbxGetEntryDescTfer->MbxData).CoE.wStationAddress,
                                   local_128,(ulong)(pMbxGetEntryDescTfer->MbxData).CoE.wIndex,
                                   (ulong)(pMbxGetEntryDescTfer->MbxData).CoE.bySubIndex,
                                   in_stack_fffffffffffffaa8,in_stack_fffffffffffffab0);
                        if (bVar12) {
                          LinuxSleep(2);
                        }
                      }
                      if ((pMbxGetEntryDescTfer->MbxData).CoE.bySubIndex == '\a') {
                        local_b2 = 1;
                      }
                      else {
                        local_b2 = 0xffff;
                      }
                      _wSubIndex = _wSubIndex + 1;
                      for (local_b4 = 0; local_b4 < local_b2 && pbyODLTferBuffer._4_4_ == 0;
                          local_b4 = local_b4 + 1) {
                        ((EC_T_MBXTFER *)pwODList)->dwClntId = dwClientId;
                        ((EC_T_MBXTFER *)pwODList)->dwDataLen =
                             (((EC_T_MBXTFER *)pwODList)->MbxTferDesc).dwMaxDataLen;
                        EVar5 = _wSubIndex + 1;
                        ((EC_T_MBXTFER *)pwODList)->dwTferId = _wSubIndex;
                        bVar2 = (byte)local_b4;
                        in_stack_fffffffffffffaa8 =
                             (char *)CONCAT44((int)((ulong)in_stack_fffffffffffffaa8 >> 0x20),
                                              dwTimeout);
                        EVar4 = emCoeGetEntryDesc(dwInstanceID,pwODList,dwNodeId,
                                                  *(undefined2 *)
                                                   ((long)pvStack_a0 +
                                                   (ulong)(ushort)dwUniqueTransferId * 2),bVar2,0x7f
                                                  ,in_stack_fffffffffffffaa8);
                        if (EVar4 == 0x9811010e) goto LAB_00153825;
                        _wSubIndex = EVar5;
                        if ((EVar4 == 0x98110006) || (EVar4 == 0x98110053)) break;
                        HandleMbxTferReqError
                                  (poLog,"CoeReadObjectDictionary: Error in emCoeGetEntryDesc",EVar4
                                   ,(EC_T_MBXTFER *)pwODList);
                        uVar14 = (undefined4)((ulong)in_stack_fffffffffffffaa8 >> 0x20);
                        if (EVar4 != 0) goto LAB_00153825;
                        if (1 < nVerbosePrinting) {
                          memset(&local_168,0,0x32);
                          memset(szUnitType + 6,0,0x32);
                          szUnitType[2] = '\0';
                          szUnitType[3] = '\0';
                          szUnitType[4] = '\0';
                          szUnitType[5] = '\0';
                          memset(szDefaultValue + 2,0,10);
                          memset(szMinValue + 2,0,10);
                          memset(szMaxValue + 2,0,10);
                          memset(szDescription + 0x2c,0,10);
                          memset(local_208,0,0x32);
                          abySDOValue[0x1f8] = '\0';
                          abySDOValue[0x1f9] = '\0';
                          abySDOValue[0x1fa] = '\0';
                          abySDOValue[0x1fb] = '\0';
                          abySDOValue[0x1fc] = '\0';
                          abySDOValue[0x1fd] = '\0';
                          abySDOValue[0x1fe] = '\0';
                          abySDOValue[0x1ff] = '\0';
                          memset(&local_168,0,0x32);
                          memset(szUnitType + 6,0,0x32);
                          memset(szDefaultValue + 2,0,10);
                          memset(szMinValue + 2,0,10);
                          memset(szMaxValue + 2,0,10);
                          memset(szDescription + 0x2c,0,10);
                          memset(local_208,0,0x32);
                          if (((((EC_T_MBXTFER *)pwODList)->MbxData).CoE_EntryDesc.byObAccess & 1)
                              == 0) {
                            local_168 = 0x20;
                          }
                          else {
                            local_168 = 0x52;
                          }
                          if (((((EC_T_MBXTFER *)pwODList)->MbxData).CoE_EntryDesc.byObAccess & 8)
                              == 0) {
                            uStack_167 = 0x20;
                          }
                          else {
                            uStack_167 = 0x57;
                          }
                          uStack_166 = 0x2e;
                          if (((((EC_T_MBXTFER *)pwODList)->MbxData).CoE_EntryDesc.byObAccess & 2)
                              == 0) {
                            uStack_165 = 0x20;
                          }
                          else {
                            uStack_165 = 0x52;
                          }
                          if (((((EC_T_MBXTFER *)pwODList)->MbxData).CoE_EntryDesc.byObAccess & 0x10
                              ) == 0) {
                            nAccessIdx._0_1_ = 0x20;
                          }
                          else {
                            nAccessIdx._0_1_ = 0x57;
                          }
                          nAccessIdx._1_1_ = 0x2e;
                          if (((((EC_T_MBXTFER *)pwODList)->MbxData).CoE_EntryDesc.byObAccess & 4)
                              == 0) {
                            nAccessIdx._2_1_ = 0x20;
                          }
                          else {
                            nAccessIdx._2_1_ = 0x52;
                          }
                          if (((((EC_T_MBXTFER *)pwODList)->MbxData).CoE_EntryDesc.byObAccess & 0x20
                              ) == 0) {
                            nAccessIdx._3_1_ = 0x20;
                          }
                          else {
                            nAccessIdx._3_1_ = 0x57;
                          }
                          if (((((EC_T_MBXTFER *)pwODList)->MbxData).CoE_EntryDesc.bRxPdoMapping !=
                               0) && (strncpy(szUnitType + 6,"-RxPDO",0x31),
                                     (((EC_T_MBXTFER *)pwODList)->MbxData).CoE_EntryDesc.
                                     bTxPdoMapping != 0)) {
                            sVar7 = strlen(szUnitType + 6);
                            sVar8 = strlen(szUnitType + 6);
                            strncpy(szUnitType + sVar7 + 6,"+TxPDO",0x31 - sVar8);
                          }
                          if (((((EC_T_MBXTFER *)pwODList)->MbxData).CoE_EntryDesc.byValueInfo & 8)
                              != 0) {
                            EVar4 = EC_GETDWORD((((EC_T_MBXTFER *)pwODList)->MbxData).CoE_EntryDesc.
                                                pbyData);
                            EcSnprintf(szDefaultValue + 2,9,", UnitType 0x%08X",EVar4);
                            szUnitType._2_4_ = szUnitType._2_4_ + 4;
                          }
                          if (((((EC_T_MBXTFER *)pwODList)->MbxData).CoE_EntryDesc.byValueInfo &
                              0x10) != 0) {
                            strncpy(szMinValue + 2,", Default",9);
                            szUnitType._2_4_ =
                                 ((int)((((EC_T_MBXTFER *)pwODList)->MbxData).CoE_ODList.wRes + 7)
                                 >> 3) + szUnitType._2_4_;
                          }
                          if (((((EC_T_MBXTFER *)pwODList)->MbxData).CoE_EntryDesc.byValueInfo &
                              0x20) != 0) {
                            strncpy(szMaxValue + 2,", Min",9);
                            szUnitType._2_4_ =
                                 ((int)((((EC_T_MBXTFER *)pwODList)->MbxData).CoE_ODList.wRes + 7)
                                 >> 3) + szUnitType._2_4_;
                          }
                          if (((((EC_T_MBXTFER *)pwODList)->MbxData).CoE_EntryDesc.byValueInfo &
                              0x40) != 0) {
                            strncpy(szDescription + 0x2c,", Max",9);
                            abySDOValue._504_8_ =
                                 (((EC_T_MBXTFER *)pwODList)->MbxData).CoE_EntryDesc.pbyData +
                                 (int)szUnitType._2_4_;
                            szUnitType._2_4_ =
                                 ((int)((((EC_T_MBXTFER *)pwODList)->MbxData).CoE_ODList.wRes + 7)
                                 >> 3) + szUnitType._2_4_;
                          }
                          if (szUnitType._2_4_ + 1 <=
                              (int)(uint)(((EC_T_MBXTFER *)pwODList)->MbxData).CoE_EntryDesc.
                                         wDataLen) {
                            if ((int)(((uint)(((EC_T_MBXTFER *)pwODList)->MbxData).CoE_EntryDesc.
                                             wDataLen - szUnitType._2_4_) + 1) < 0x31) {
                              local_464 = ((uint)(((EC_T_MBXTFER *)pwODList)->MbxData).CoE_EntryDesc
                                                 .wDataLen - szUnitType._2_4_) + 1;
                            }
                            else {
                              local_464 = 0x31;
                            }
                            EcSnprintf(local_208,local_464,"%s",
                                       (((EC_T_MBXTFER *)pwODList)->MbxData).CoE_EntryDesc.pbyData +
                                       (int)szUnitType._2_4_);
                          }
                          in_stack_fffffffffffffab0 = &local_168;
                          in_stack_fffffffffffffab8 = szUnitType + 6;
                          in_stack_fffffffffffffac0 = szDefaultValue + 2;
                          in_stack_fffffffffffffaa8 =
                               (char *)CONCAT44(uVar14,(uint)(((EC_T_MBXTFER *)pwODList)->MbxData).
                                                             CoE_ODList.wRes);
                          CAtEmLogging::LogMsg
                                    (poLog,"%04x:%d %s: type=0x%04x, len=%02d, %s%s%s",
                                     (ulong)(((EC_T_MBXTFER *)pwODList)->MbxData).CoE.
                                            wStationAddress,
                                     (ulong)(((EC_T_MBXTFER *)pwODList)->MbxData).CoE_EntryDesc.
                                            byObSubIndex,local_208,
                                     (ulong)(((EC_T_MBXTFER *)pwODList)->MbxData).CoE_ODList.wLen,
                                     in_stack_fffffffffffffaa8,in_stack_fffffffffffffab0,
                                     in_stack_fffffffffffffab8,in_stack_fffffffffffffac0,
                                     szMinValue + 2,szMaxValue + 2,szDescription + 0x2c);
                          if (bVar12) {
                            LinuxSleep(2);
                          }
                        }
                        uVar14 = (undefined4)((ulong)in_stack_fffffffffffffab0 >> 0x20);
                        if ((((EC_T_MBXTFER *)pwODList)->MbxData).CoE_ODList.wLen != 0) {
                          if (bPerformUpload != 0) {
                            memset(&local_428,0,0x200);
                            pDiag._4_4_ = 0;
                            if (((((EC_T_MBXTFER *)pwODList)->MbxData).CoE_ODList.wRes + 7) / 8 <
                                0x201) {
                              local_480 = ((((EC_T_MBXTFER *)pwODList)->MbxData).CoE_ODList.wRes + 7
                                          ) / 8;
                            }
                            else {
                              local_480 = 0x200;
                            }
                            in_stack_fffffffffffffaa8 = (char *)((long)&pDiag + 4);
                            in_stack_fffffffffffffab0 = (undefined1 *)CONCAT44(uVar14,dwTimeout);
                            in_stack_fffffffffffffab8 =
                                 (EC_T_CHAR *)
                                 ((ulong)in_stack_fffffffffffffab8 & 0xffffffff00000000);
                            uVar6 = emCoeSdoUpload(dwInstanceID,dwNodeId,
                                                   *(undefined2 *)
                                                    ((long)pvStack_a0 +
                                                    (ulong)(ushort)dwUniqueTransferId * 2),bVar2,
                                                   &local_428,local_480,in_stack_fffffffffffffaa8,
                                                   in_stack_fffffffffffffab0,
                                                   in_stack_fffffffffffffab8);
                            if (uVar6 == 0x9811010e) {
                              EVar4 = 0x9811010e;
                              goto LAB_00153825;
                            }
                            if (uVar6 != 0) {
                              uVar9 = ecatGetText(uVar6);
                              CAtEmLogging::LogError
                                        (poLog,
                                         "CoeReadObjectDictionary: Error in ecatCoeSdoUpload: %s (0x%lx)"
                                         ,uVar9,(ulong)uVar6);
                              pbyODLTferBuffer._4_4_ = uVar6;
                              goto LAB_001537ee;
                            }
                            if ((((pMbxGetEntryDescTfer->MbxData).CoE.bySubIndex == '\t') &&
                                (local_b4 == 0)) ||
                               (((pMbxGetEntryDescTfer->MbxData).CoE.bySubIndex == '\b' &&
                                (local_b4 == 0)))) {
                              local_b2 = (ushort)(byte)((byte)local_428 + 1);
                            }
                            if (1 < nVerbosePrinting) {
                              uVar14 = (undefined4)((ulong)in_stack_fffffffffffffaa8 >> 0x20);
                              uVar15 = (undefined4)((ulong)in_stack_fffffffffffffab0 >> 0x20);
                              uVar16 = (undefined4)((ulong)in_stack_fffffffffffffab8 >> 0x20);
                              switch((((EC_T_MBXTFER *)pwODList)->MbxData).CoE_ODList.wLen) {
                              case 1:
                              case 2:
                              case 5:
                              case 0x30:
                              case 0x31:
                              case 0x32:
                              case 0x33:
                              case 0x34:
                              case 0x35:
                              case 0x36:
                              case 0x37:
                                CAtEmLogging::LogMsg
                                          (poLog,"%04x:%d BYTE: 0x%02X",
                                           (ulong)*(ushort *)
                                                   ((long)pvStack_a0 +
                                                   (ulong)(ushort)dwUniqueTransferId * 2),
                                           (ulong)bVar2,(ulong)(byte)local_428);
                                break;
                              case 3:
                                uVar1 = *(ushort *)
                                         ((long)pvStack_a0 + (ulong)(ushort)dwUniqueTransferId * 2);
                                EVar3 = EC_GETWORD(&local_428);
                                CAtEmLogging::LogMsg
                                          (poLog,"%04x:%d SI16: %04d",(ulong)uVar1,(ulong)bVar2,
                                           (ulong)EVar3);
                                break;
                              case 4:
                                uVar1 = *(ushort *)
                                         ((long)pvStack_a0 + (ulong)(ushort)dwUniqueTransferId * 2);
                                EVar4 = EC_GETDWORD(&local_428);
                                CAtEmLogging::LogMsg
                                          (poLog,"%04x:%d SI32: %08ld",(ulong)uVar1,(ulong)bVar2,
                                           (ulong)EVar4);
                                break;
                              case 6:
                                uVar1 = *(ushort *)
                                         ((long)pvStack_a0 + (ulong)(ushort)dwUniqueTransferId * 2);
                                EVar3 = EC_GETWORD(&local_428);
                                CAtEmLogging::LogMsg
                                          (poLog,"%04x:%d WORD: 0x%04X",(ulong)uVar1,(ulong)bVar2,
                                           (ulong)EVar3);
                                break;
                              case 7:
                                uVar1 = *(ushort *)
                                         ((long)pvStack_a0 + (ulong)(ushort)dwUniqueTransferId * 2);
                                EVar4 = EC_GETDWORD(&local_428);
                                CAtEmLogging::LogMsg
                                          (poLog,"%04x:%d DWRD: 0x%08lX",(ulong)uVar1,(ulong)bVar2,
                                           (ulong)EVar4);
                                break;
                              default:
                                CAtEmLogging::LogMsg
                                          (poLog,"%04x:%d DFLT: ",
                                           (ulong)*(ushort *)
                                                   ((long)pvStack_a0 +
                                                   (ulong)(ushort)dwUniqueTransferId * 2),
                                           (ulong)bVar2);
                                for (local_43c = 0; local_43c < pDiag._4_4_;
                                    local_43c = local_43c + 1) {
                                  CAtEmLogging::LogMsgAdd
                                            (poLog,"%02x ",
                                             (ulong)*(byte *)((long)&local_428 + (ulong)local_43c));
                                  if ((local_43c != 0) && ((local_43c & 7) == 0)) {
                                    CAtEmLogging::LogMsgAdd(poLog," ");
                                  }
                                  if ((local_43c != 0) && ((local_43c & 0x1f) == 0)) {
                                    CAtEmLogging::LogMsgAdd(poLog,"\n");
                                  }
                                }
                                CAtEmLogging::LogMsg(poLog,"");
                                break;
                              case 9:
                                CAtEmLogging::LogMsg
                                          (poLog,"%04x:%d STRG: %s",
                                           (ulong)*(ushort *)
                                                   ((long)pvStack_a0 +
                                                   (ulong)(ushort)dwUniqueTransferId * 2),
                                           (ulong)bVar2,&local_428);
                                break;
                              case 10:
                                if ((*(short *)((long)pvStack_a0 +
                                               (ulong)(ushort)dwUniqueTransferId * 2) == 0x10f3) &&
                                   (5 < bVar2)) {
                                  if (((ushort)dwUploadBytes & 0xf) == 2) {
                                    local_4f0 = "ERR";
                                  }
                                  else {
                                    if (((ushort)dwUploadBytes & 0xf) == 1) {
                                      local_4f8 = "WARN";
                                    }
                                    else {
                                      if (((ushort)dwUploadBytes & 0xf) == 0) {
                                        local_500 = "INF";
                                      }
                                      else {
                                        local_500 = "UNK";
                                      }
                                      local_4f8 = local_500;
                                    }
                                    local_4f0 = local_4f8;
                                  }
                                  in_stack_fffffffffffffaa8 =
                                       (char *)CONCAT44(uVar14,(uint)dwUploadBytes._2_2_);
                                  in_stack_fffffffffffffab0 =
                                       (undefined1 *)CONCAT44(uVar15,SUB84(abySDOValue._0_8_,4));
                                  in_stack_fffffffffffffab8 =
                                       (EC_T_CHAR *)CONCAT44(uVar16,(int)abySDOValue._0_8_);
                                  CAtEmLogging::LogMsg
                                            (poLog,
                                             "%04x:%d DIAG # 0x%lx type <%s> Text 0x%x Time: 0x%x.%x"
                                             ,(ulong)*(ushort *)
                                                      ((long)pvStack_a0 +
                                                      (ulong)(ushort)dwUniqueTransferId * 2),
                                             (ulong)bVar2,(ulong)local_428,local_4f0,
                                             in_stack_fffffffffffffaa8,in_stack_fffffffffffffab0,
                                             in_stack_fffffffffffffab8);
                                  ParseDiagMsg(poLog,&local_428);
                                }
                                else {
                                  CAtEmLogging::LogMsg
                                            (poLog,"%04x:%d OCTS: %s",
                                             (ulong)*(ushort *)
                                                     ((long)pvStack_a0 +
                                                     (ulong)(ushort)dwUniqueTransferId * 2),
                                             (ulong)bVar2,&local_428);
                                }
                                break;
                              case 0x19:
                                in_stack_fffffffffffffaa8 =
                                     (char *)(CONCAT44(uVar14,local_428 >> 0x10) &
                                             0xffffffff000000ff);
                                in_stack_fffffffffffffab0 =
                                     (undefined1 *)CONCAT44(uVar15,local_428 >> 0x18);
                                in_stack_fffffffffffffab8 =
                                     (EC_T_CHAR *)CONCAT44(uVar16,(uint)(byte)dwUploadBytes);
                                in_stack_fffffffffffffac0 =
                                     (EC_T_CHAR *)
                                     CONCAT44((int)((ulong)in_stack_fffffffffffffac0 >> 0x20),
                                              (uint)dwUploadBytes._1_1_);
                                CAtEmLogging::LogMsg
                                          (poLog,"%04x:%d US48: %02X:%02X:%02X:%02X:%02X:%02X",
                                           (ulong)*(ushort *)
                                                   ((long)pvStack_a0 +
                                                   (ulong)(ushort)dwUniqueTransferId * 2),
                                           (ulong)bVar2,(ulong)(byte)local_428,
                                           (ulong)local_428._1_1_,in_stack_fffffffffffffaa8,
                                           in_stack_fffffffffffffab0,in_stack_fffffffffffffab8,
                                           in_stack_fffffffffffffac0);
                                break;
                              case 0x1b:
                                uVar1 = *(ushort *)
                                         ((long)pvStack_a0 + (ulong)(ushort)dwUniqueTransferId * 2);
                                EVar10 = EC_GETQWORD(&local_428);
                                EVar11 = EC_GETQWORD(&local_428);
                                CAtEmLogging::LogMsg
                                          (poLog,"%04x:%d QWRD: 0x%08lX.%08lX",(ulong)uVar1,
                                           (ulong)bVar2,EVar10 >> 0x20,EVar11 & 0xffffffff);
                              }
                              if (((0x2fff < *(ushort *)
                                              ((long)pvStack_a0 +
                                              (ulong)(ushort)dwUniqueTransferId * 2)) &&
                                  (bVar2 == 1)) && (EVar4 = EC_GETDWORD(&local_428), EVar4 == 0))
                              break;
                              if (bVar12) {
                                LinuxSleep(2);
                              }
                            }
                          }
                          pMbxGetEntryDescTfer->eTferStatus = eMbxTferStatus_Idle;
                        }
LAB_001537ee:
                      }
                      dwUniqueTransferId._0_2_ = (ushort)dwUniqueTransferId + 1;
                    }
                    pbyODLTferBuffer._4_4_ = 0;
                    EVar4 = pbyODLTferBuffer._4_4_;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_00153825:
  pbyODLTferBuffer._4_4_ = EVar4;
  if (pMbxGetObDescTfer != (EC_T_MBXTFER *)0x0) {
    emMbxTferDelete(dwInstanceID,pMbxGetObDescTfer);
  }
  if (pMbxGetEntryDescTfer != (EC_T_MBXTFER *)0x0) {
    emMbxTferDelete(dwInstanceID,pMbxGetEntryDescTfer);
  }
  if (pwODList != (EC_T_WORD *)0x0) {
    emMbxTferDelete(dwInstanceID,pwODList);
  }
  if (pvStack_a0 != (void *)0x0) {
    free(pvStack_a0);
  }
  if (pbyOBDescTferBuffer != (EC_T_BYTE *)0x0) {
    free(pbyOBDescTferBuffer);
  }
  if (pbyGetEntryTferBuffer != (EC_T_BYTE *)0x0) {
    free(pbyGetEntryTferBuffer);
  }
  if (MbxTferDesc.pbyMbxTferDescData != (EC_T_BYTE *)0x0) {
    free(MbxTferDesc.pbyMbxTferDescData);
  }
  return pbyODLTferBuffer._4_4_;
}

Assistant:

EC_T_DWORD CoeReadObjectDictionary
   (EC_T_DWORD              dwInstanceID
   ,CAtEmLogging*           poLog               /**< [in]   Logging Instance */
   ,EC_T_INT                nVerbosePrinting   /**< [in]   Print messages */
   ,EC_T_BOOL*              pbStopReading   /**< [in]   Pointer to shutdwon flag */
   ,EC_T_DWORD              dwClientId      /**< [in]   Current client ID */
   ,EC_T_DWORD              dwNodeId        /**< [in]   Slave Id to query ODL from  */
   ,EC_T_BOOL               bPerformUpload  /**< [in]   EC_TRUE: do SDO Upload */
   ,EC_T_DWORD              dwTimeout       /**< [in]   Individual call timeout */
                                  )
{
    /* buffer sizes */
#define CROD_ODLTFER_SIZE       ((EC_T_DWORD)0x1200)
#define CROD_OBDESC_SIZE        ((EC_T_DWORD)100)
#define CROD_ENTRYDESC_SIZE     ((EC_T_DWORD)100)
#define CROD_MAXSISDO_SIZE      ((EC_T_DWORD)0x200)
#define MAX_OBNAME_LEN          ((EC_T_DWORD)100)

    /* variables */
    EC_T_DWORD          dwRetVal                = EC_E_ERROR;   /* return value */
    EC_T_DWORD          dwRes                   = EC_E_ERROR;   /* tmp return value for API calls */
    EC_T_BYTE*          pbyODLTferBuffer        = EC_NULL;      /* OD List */
    EC_T_BYTE*          pbyOBDescTferBuffer     = EC_NULL;      /* OB Desc */
    EC_T_BYTE*          pbyGetEntryTferBuffer   = EC_NULL;      /* Entry Desc */
    EC_T_MBXTFER_DESC   MbxTferDesc             = {0};          /* mailbox transfer descriptor */
    EC_T_MBXTFER*       pMbxGetODLTfer          = EC_NULL;      /* mailbox transfer object for OD list upload */
    EC_T_MBXTFER*       pMbxGetObDescTfer       = EC_NULL;      /* mailbox transfer object for Object description upload */
    EC_T_MBXTFER*       pMbxGetEntryDescTfer    = EC_NULL;      /* mailbox transfer object for Entry description upload */

    EC_T_WORD*          pwODList                = EC_NULL;      /* is going to carry ALL list of OD */
    EC_T_WORD           wODListLen              = 0;            /* used entries in pwODList */
    EC_T_WORD           wIndex                  = 0;            /* index to parse OD List */

    EC_T_BYTE           byValueInfoType         = 0;
    EC_T_DWORD          dwUniqueTransferId      = 0;
    EC_T_BOOL           bReadingMasterOD        = EC_FALSE;

    /* Check Parameters */
    if ((EC_NULL == poLog)
     || (EC_NULL == pbStopReading)
     || (EC_NOWAIT == dwTimeout))
    {
        dwRetVal = EC_E_INVALIDPARM;
        goto Exit;
    }

    /* Create Memory */
    pbyODLTferBuffer        = (EC_T_BYTE*)OsMalloc(CROD_ODLTFER_SIZE);
    pbyOBDescTferBuffer     = (EC_T_BYTE*)OsMalloc(CROD_OBDESC_SIZE);
    pbyGetEntryTferBuffer   = (EC_T_BYTE*)OsMalloc(CROD_ENTRYDESC_SIZE);

    /* check if alloc was ok */
    if ((EC_NULL == pbyODLTferBuffer)
     || (EC_NULL == pbyOBDescTferBuffer)
     || (EC_NULL == pbyGetEntryTferBuffer))
    {
        dwRetVal = EC_E_NOMEMORY;
        goto Exit;
    }

    OsMemset(pbyODLTferBuffer,      0, CROD_ODLTFER_SIZE);
    OsMemset(pbyOBDescTferBuffer,   0, CROD_OBDESC_SIZE);
    OsMemset(pbyGetEntryTferBuffer, 0, CROD_ENTRYDESC_SIZE);

    /* create required MBX Transfer Objects */
    /* mailbox transfer object for OD list upload */
    MbxTferDesc.dwMaxDataLen        = CROD_ODLTFER_SIZE;
    MbxTferDesc.pbyMbxTferDescData  = pbyODLTferBuffer;

    pMbxGetODLTfer = emMbxTferCreate(dwInstanceID, &MbxTferDesc);
    if (EC_NULL == pMbxGetODLTfer)
    {
        dwRetVal = EC_E_NOMEMORY;
        goto Exit;
    }

    /* mailbox transfer object for Object description upload */
    MbxTferDesc.dwMaxDataLen        = CROD_OBDESC_SIZE;
    MbxTferDesc.pbyMbxTferDescData  = pbyOBDescTferBuffer;

    pMbxGetObDescTfer = emMbxTferCreate(dwInstanceID, &MbxTferDesc);
    if (EC_NULL == pMbxGetObDescTfer)
    {
        dwRetVal = EC_E_NOMEMORY;
        goto Exit;
    }

    /* mailbox transfer object for Entry description upload */
    MbxTferDesc.dwMaxDataLen        = CROD_ENTRYDESC_SIZE;
    MbxTferDesc.pbyMbxTferDescData  = pbyGetEntryTferBuffer;

    pMbxGetEntryDescTfer = emMbxTferCreate(dwInstanceID, &MbxTferDesc);
    if (EC_NULL == pMbxGetEntryDescTfer)
    {
        dwRetVal = EC_E_NOMEMORY;
        goto Exit;
    }

    /* Get OD List Type: ALL */
    pMbxGetODLTfer->dwClntId    = dwClientId;
    pMbxGetODLTfer->dwTferId    = dwUniqueTransferId++;
    pMbxGetODLTfer->dwDataLen   = pMbxGetODLTfer->MbxTferDesc.dwMaxDataLen;

    /* get list of object indexes */
    dwRes = emCoeGetODList(dwInstanceID, pMbxGetODLTfer, dwNodeId, eODListType_ALL, dwTimeout);
    if (EC_E_SLAVE_NOT_PRESENT == dwRes)
    {
        dwRetVal = dwRes;
        goto Exit;
    }

    /* wait until transfer object is available incl. logging error */
    HandleMbxTferReqError(poLog, (EC_T_CHAR*)"CoeReadObjectDictionary: Error in emCoeGetODList(ALL)", dwRes, pMbxGetODLTfer);
    if (EC_E_NOERROR != dwRes)
    {
        dwRetVal = dwRes;
        goto Exit;
    }

    /* OD Tfer object now shall contain complete list of OD Objects, store it for more processing */
    pwODList = (EC_T_WORD*)OsMalloc(sizeof(EC_T_WORD) * pMbxGetODLTfer->MbxData.CoE_ODList.wLen);
    if (EC_NULL == pwODList)
    {
        dwRetVal = EC_E_NOMEMORY;
        goto Exit;
    }
    OsMemset(pwODList, 0, sizeof(EC_T_WORD) * pMbxGetODLTfer->MbxData.CoE_ODList.wLen);

    /* reading master OD */
    if (MASTER_SLAVE_ID == dwNodeId)
    {
        bReadingMasterOD = EC_TRUE;
    }

    /* now display Entries of ODList and store non-empty values */
    if (nVerbosePrinting > 1)
    {
        CRODLMsg( "Complete OD list:" );
    }

    /* iterate through all entries in list */
    for (wODListLen = 0, wIndex = 0; wIndex < (pMbxGetODLTfer->MbxData.CoE_ODList.wLen); wIndex++)
    {
        /* store next index */
        pwODList[wODListLen] = pMbxGetODLTfer->MbxData.CoE_ODList.pwOdList[wIndex];

        /* show indices */
        if (nVerbosePrinting > 1)
        {
            CRODLMsgAdd("%04X ", pwODList[wODListLen]);
            if (((wIndex+1) % 10) == 0) CRODLMsg(""); /* break lines each 10 entries */
        }

        /* to store only non empty index entries, increment List Length only if non zero entry */
        if (0 != pwODList[wODListLen])
        {
            wODListLen++;
        }
    }

    /* give logging task a chance to flush */
    if (nVerbosePrinting > 1)
    {
        CRODLMsg("");
        OsSleep(2);
    }
    /* MbxGetODLTfer done */
    pMbxGetODLTfer->eTferStatus = eMbxTferStatus_Idle;

    /* Get OD List Type: RX PDO Map */
    pMbxGetODLTfer->dwClntId    = dwClientId;
    pMbxGetODLTfer->dwTferId    = dwUniqueTransferId++;
    pMbxGetODLTfer->dwDataLen   = pMbxGetODLTfer->MbxTferDesc.dwMaxDataLen;

    dwRes = emCoeGetODList(dwInstanceID, pMbxGetODLTfer, dwNodeId, eODListType_RxPdoMap, dwTimeout);
    if (EC_E_SLAVE_NOT_PRESENT == dwRes)
    {
        dwRetVal = dwRes;
        goto Exit;
    }

    /* wait until transfer object is available incl. logging error */
    HandleMbxTferReqError(poLog, (EC_T_CHAR*)"CoeReadObjectDictionary: Error in emCoeGetODList(RxPdoMap)", dwRes, pMbxGetODLTfer);
    if (EC_E_NOERROR != dwRes)
    {
        dwRetVal = dwRes;
        goto Exit;
    }

    /* now display Entries of ODList */
    if (nVerbosePrinting > 1)
    {
        CRODLMsg( "RX PDO Mappable Objects:" );
        /* iterate through all entries in list */
        for (wIndex = 0; wIndex < (pMbxGetODLTfer->MbxData.CoE_ODList.wLen); wIndex++)
        {
            CRODLMsgAdd("%04X ", pMbxGetODLTfer->MbxData.CoE_ODList.pwOdList[wIndex]);

            if (((wIndex+1) % 10) == 0) CRODLMsg(""); /* break lines each 10 entries */
        }

        CRODLMsg("");
    }
    /* MbxGetODLTfer done */
    pMbxGetODLTfer->eTferStatus = eMbxTferStatus_Idle;

    /* Get OD List Type: TX PDO Map */
    pMbxGetODLTfer->dwClntId    = dwClientId;
    pMbxGetODLTfer->dwTferId    = dwUniqueTransferId++;
    pMbxGetODLTfer->dwDataLen   = pMbxGetODLTfer->MbxTferDesc.dwMaxDataLen;

    dwRes = emCoeGetODList(dwInstanceID, pMbxGetODLTfer, dwNodeId, eODListType_TxPdoMap, dwTimeout);
    if (EC_E_SLAVE_NOT_PRESENT == dwRes)
    {
        dwRetVal = dwRes;
        goto Exit;
    }

    /* wait until transfer object is available incl. logging error */
    HandleMbxTferReqError(poLog, (EC_T_CHAR*)"CoeReadObjectDictionary: Error in emCoeGetODList(TxPdoMap)", dwRes, pMbxGetODLTfer);
    if (EC_E_NOERROR != dwRes)
    {
        dwRetVal = dwRes;
        goto Exit;
    }

    /* now display Entries of ODList */
    if (nVerbosePrinting > 1)
    {
        CRODLMsg( "TX PDO Mappable Objects:" );
        /* iterate through all entries in list */
        for( wIndex = 0; wIndex < (pMbxGetODLTfer->MbxData.CoE_ODList.wLen); wIndex++ )
        {
            CRODLMsgAdd("%04X ", pMbxGetODLTfer->MbxData.CoE_ODList.pwOdList[wIndex]);

            if( ((wIndex+1) % 10) == 0) CRODLMsg(""); /* break lines each 10 entries */
        }

        CRODLMsg("");
    }
    /* MbxGetODLTfer done */
    pMbxGetODLTfer->eTferStatus = eMbxTferStatus_Idle;

    /* now iterate through Index list, to get closer info, sub indexes and values */

    /* get object description for all objects */
    if (nVerbosePrinting > 1)
    {
        CRODLMsg("");
        CRODLMsg("*************************************************************");
        CRODLMsg("****                  OBJECT DESCRIPTION                 ****");
        CRODLMsg("*************************************************************");
    }

    /* init value info type */
    byValueInfoType = EC_COE_ENTRY_ObjAccess
                    | EC_COE_ENTRY_ObjCategory
                    | EC_COE_ENTRY_PdoMapping
                    | EC_COE_ENTRY_UnitType
                    | EC_COE_ENTRY_DefaultValue
                    | EC_COE_ENTRY_MinValue
                    | EC_COE_ENTRY_MaxValue;

    /* now dwRetVal is used to recognize loop break condition on error, so set it to OK here */
    dwRetVal = EC_E_NOERROR;
    for (wIndex = 0; (wIndex < wODListLen) && (EC_E_NOERROR == dwRetVal) && !*pbStopReading; wIndex++)
    {
        EC_T_WORD   wSubIndexLimit  = 0xffff; /* must be greater 8 bit because wSubIndexLimit can go to 0x100 if subindex is 0xff */
        EC_T_WORD   wSubIndex       = 0;

        /* get Object Description */
        pMbxGetObDescTfer->dwClntId     = dwClientId;
        pMbxGetObDescTfer->dwDataLen    = pMbxGetObDescTfer->MbxTferDesc.dwMaxDataLen;
        pMbxGetObDescTfer->dwTferId     = dwUniqueTransferId++;

        /* get object description */
        dwRes = emCoeGetObjectDesc(dwInstanceID, pMbxGetObDescTfer, dwNodeId, pwODList[wIndex], dwTimeout);
        if (EC_E_SLAVE_NOT_PRESENT == dwRes)
        {
            dwRetVal = dwRes;
            goto Exit;
        }

        /* wait until transfer object is available incl. logging error */
        HandleMbxTferReqError(poLog, (EC_T_CHAR*)"CoeReadObjectDictionary: Error in emCoeGetObjectDesc", dwRes, pMbxGetODLTfer);
        if (EC_E_NOERROR != dwRes)
        {
            dwRetVal = dwRes;
            goto Exit;
        }

        /* display ObjectDesc */
        if (nVerbosePrinting > 1)
        {
            EC_T_WORD   wNameLen                    = 0;
            EC_T_CHAR   szObName[MAX_OBNAME_LEN]    = {0};

            wNameLen = pMbxGetObDescTfer->MbxData.CoE_ObDesc.wObNameLen;
            wNameLen = (EC_T_WORD)EC_MIN(wNameLen, MAX_OBNAME_LEN - 1);

            OsStrncpy(szObName, pMbxGetObDescTfer->MbxData.CoE_ObDesc.pchObName, (EC_T_INT)wNameLen);
            szObName[wNameLen] = '\0';

            CRODLMsg( "%04x %s: type 0x%04x, code=0x%02x, %s, SubIds=%d",
                pMbxGetObDescTfer->MbxData.CoE_ObDesc.wObIndex,
                szObName,
                pMbxGetObDescTfer->MbxData.CoE_ObDesc.wDataType,
                pMbxGetObDescTfer->MbxData.CoE_ObDesc.byObjCode,
                ((pMbxGetObDescTfer->MbxData.CoE_ObDesc.byObjCategory==0)?"optional":"mandatory"),
                pMbxGetObDescTfer->MbxData.CoE_ObDesc.byMaxNumSubIndex
                  );

            /* give logging task a chance to flush */
            if (bReadingMasterOD)
                OsSleep(2);
        }

        /* if Object is Single Variable, only subindex 0 is defined */
        if (OBJCODE_VAR == pMbxGetObDescTfer->MbxData.CoE_ObDesc.byObjCode)
        {
            wSubIndexLimit = 1;
        }
        else
        {
            wSubIndexLimit = 0xffff;
        }

        /* iterate through sub-indexes */
        for (wSubIndex = 0; (wSubIndex < wSubIndexLimit) && (EC_E_NOERROR == dwRetVal); wSubIndex++)
        {
            /* Get Entry Description */
            pMbxGetEntryDescTfer->dwClntId     = dwClientId;
            pMbxGetEntryDescTfer->dwDataLen    = pMbxGetEntryDescTfer->MbxTferDesc.dwMaxDataLen;
            pMbxGetEntryDescTfer->dwTferId     = dwUniqueTransferId++;

            dwRes = emCoeGetEntryDesc(
                dwInstanceID, pMbxGetEntryDescTfer, dwNodeId, pwODList[wIndex], EC_LOBYTE(wSubIndex), byValueInfoType, dwTimeout
                                     );
            if (EC_E_SLAVE_NOT_PRESENT == dwRes)
            {
                dwRetVal = dwRes;
                goto Exit;
            }

            /* break after last index */
            if ((EC_E_INVALIDDATA == dwRes)
             || (EC_E_SDO_ABORTCODE_OFFSET == dwRes))
            {
                break;
            }

            /* handle MBX Tfer errors and wait until tfer object is available */
            HandleMbxTferReqError( poLog, (EC_T_CHAR*)"CoeReadObjectDictionary: Error in emCoeGetEntryDesc", dwRes, pMbxGetEntryDescTfer );
            if (EC_E_NOERROR != dwRes)
            {
                dwRetVal = dwRes;
                goto Exit;
            }

            /* display EntryDesc */
            if (nVerbosePrinting > 1)
            {
                EC_T_CHAR   szAccess[50]        = {0};
                EC_T_INT    nAccessIdx          = 0;
                EC_T_CHAR   szPdoMapInfo[50]    = {0};
                EC_T_INT    nDataIdx            = 0;
                EC_T_CHAR   szUnitType[10]      = {0};
                EC_T_CHAR   szDefaultValue[10]  = {0};
                EC_T_CHAR   szMinValue[10]      = {0};
                EC_T_CHAR   szMaxValue[10]      = {0};
                EC_T_CHAR   szDescription[50]   = {0};

                EC_T_DWORD  dwUnitType          = 0;
                EC_T_BYTE*  pbyDefaultValue     = EC_NULL;
                EC_T_BYTE*  pbyMinValue         = EC_NULL;
                EC_T_BYTE*  pbyMaxValue         = EC_NULL;

                OsMemset(szAccess, 0, sizeof(szAccess));
                OsMemset(szPdoMapInfo, 0, sizeof(szPdoMapInfo));
                OsMemset(szUnitType, 0, sizeof(szUnitType));
                OsMemset(szDefaultValue, 0, sizeof(szDefaultValue));
                OsMemset(szMinValue, 0, sizeof(szMinValue));
                OsMemset(szMaxValue, 0, sizeof(szMaxValue));
                OsMemset(szDescription, 0, sizeof(szDescription));

                /* build Access Right String */
                if (pMbxGetEntryDescTfer->MbxData.CoE_EntryDesc.byObAccess & EC_COE_ENTRY_Access_R_PREOP)
                    szAccess[nAccessIdx++] = 'R';
                else
                    szAccess[nAccessIdx++] = ' ';
                if (pMbxGetEntryDescTfer->MbxData.CoE_EntryDesc.byObAccess & EC_COE_ENTRY_Access_W_PREOP)
                    szAccess[nAccessIdx++] = 'W';
                else
                    szAccess[nAccessIdx++] = ' ';

                szAccess[nAccessIdx++] = '.';

                if (pMbxGetEntryDescTfer->MbxData.CoE_EntryDesc.byObAccess & EC_COE_ENTRY_Access_R_SAFEOP)
                    szAccess[nAccessIdx++] = 'R';
                else
                    szAccess[nAccessIdx++] = ' ';
                if (pMbxGetEntryDescTfer->MbxData.CoE_EntryDesc.byObAccess & EC_COE_ENTRY_Access_W_SAFEOP)
                    szAccess[nAccessIdx++] = 'W';
                else
                    szAccess[nAccessIdx++] = ' ';

                szAccess[nAccessIdx++] = '.';

                if (pMbxGetEntryDescTfer->MbxData.CoE_EntryDesc.byObAccess & EC_COE_ENTRY_Access_R_OP)
                    szAccess[nAccessIdx++] = 'R';
                else
                    szAccess[nAccessIdx++] = ' ';
                if (pMbxGetEntryDescTfer->MbxData.CoE_EntryDesc.byObAccess & EC_COE_ENTRY_Access_W_OP)
                    szAccess[nAccessIdx++] = 'W';
                else
                    szAccess[nAccessIdx++] = ' ';

                if (pMbxGetEntryDescTfer->MbxData.CoE_EntryDesc.bRxPdoMapping)
                {
                    OsStrncpy(szPdoMapInfo, "-RxPDO", sizeof(szPdoMapInfo) - 1);
                    if (pMbxGetEntryDescTfer->MbxData.CoE_EntryDesc.bTxPdoMapping)
                    {
                        OsStrncpy(&(szPdoMapInfo[OsStrlen(szPdoMapInfo)]), "+TxPDO", sizeof(szPdoMapInfo) - OsStrlen(szPdoMapInfo) - 1);
                    }
                }

                if (pMbxGetEntryDescTfer->MbxData.CoE_EntryDesc.byValueInfo & EC_COE_ENTRY_UnitType)
                {
                    dwUnitType = EC_GET_FRM_DWORD(pMbxGetEntryDescTfer->MbxData.CoE_EntryDesc.pbyData);
                    OsSnprintf(szUnitType, sizeof(szUnitType) - 1, ", UnitType 0x%08X", dwUnitType);
                    nDataIdx += 4;
                }

                if (pMbxGetEntryDescTfer->MbxData.CoE_EntryDesc.byValueInfo & EC_COE_ENTRY_DefaultValue)
                {
                    OsStrncpy(szDefaultValue, ", Default", sizeof(szDefaultValue) - 1);
                    pbyDefaultValue = &pMbxGetEntryDescTfer->MbxData.CoE_EntryDesc.pbyData[nDataIdx];
                    nDataIdx += BIT2BYTE(pMbxGetEntryDescTfer->MbxData.CoE_EntryDesc.wBitLen);
                }

                if (pMbxGetEntryDescTfer->MbxData.CoE_EntryDesc.byValueInfo & EC_COE_ENTRY_MinValue)
                {
                    OsStrncpy(szMinValue, ", Min", sizeof(szMinValue) - 1);
                    pbyMinValue = &pMbxGetEntryDescTfer->MbxData.CoE_EntryDesc.pbyData[nDataIdx];
                    nDataIdx += BIT2BYTE(pMbxGetEntryDescTfer->MbxData.CoE_EntryDesc.wBitLen);
                }

                if (pMbxGetEntryDescTfer->MbxData.CoE_EntryDesc.byValueInfo & EC_COE_ENTRY_MaxValue)
                {
                    OsStrncpy(szMaxValue, ", Max", sizeof(szMaxValue) - 1);
                    pbyMaxValue = &pMbxGetEntryDescTfer->MbxData.CoE_EntryDesc.pbyData[nDataIdx];
                    nDataIdx += BIT2BYTE(pMbxGetEntryDescTfer->MbxData.CoE_EntryDesc.wBitLen);
                }

                if (nDataIdx + 1 <= pMbxGetEntryDescTfer->MbxData.CoE_EntryDesc.wDataLen)
                {
                    OsSnprintf(szDescription, EC_MIN((EC_T_INT)(pMbxGetEntryDescTfer->MbxData.CoE_EntryDesc.wDataLen - nDataIdx + 1), (EC_T_INT)(sizeof(szDescription) - 1)),
                        "%s", &pMbxGetEntryDescTfer->MbxData.CoE_EntryDesc.pbyData[nDataIdx]);
                }

                CRODLMsg( "%04x:%d %s: type=0x%04x, len=%02d, %s%s%s",
                    pMbxGetEntryDescTfer->MbxData.CoE_EntryDesc.wObIndex,
                    pMbxGetEntryDescTfer->MbxData.CoE_EntryDesc.byObSubIndex,
                    szDescription,
                    pMbxGetEntryDescTfer->MbxData.CoE_EntryDesc.wDataType,
                    pMbxGetEntryDescTfer->MbxData.CoE_EntryDesc.wBitLen,
                    szAccess, szPdoMapInfo, szUnitType, szDefaultValue, szMinValue, szMaxValue
                    );

                EC_UNREFPARM(pbyDefaultValue);
                EC_UNREFPARM(pbyMinValue);
                EC_UNREFPARM(pbyMaxValue);

                /* give logging task a chance to flush */
                if (bReadingMasterOD)
                    OsSleep(2);
            } /* display EntryDesc */

            if (0 == pMbxGetEntryDescTfer->MbxData.CoE_EntryDesc.wDataType)
            {
                /* unknown datatype */
                continue;
            }

            /* SDO Upload */
            if (bPerformUpload)
            {
                EC_T_BYTE   abySDOValue[CROD_MAXSISDO_SIZE] = {0};
                EC_T_DWORD  dwUploadBytes                   = 0;

                /* get object's value */
                dwRes = emCoeSdoUpload(
                    dwInstanceID, dwNodeId, pwODList[wIndex], EC_LOBYTE(wSubIndex),
                    abySDOValue, EC_MIN( (EC_T_DWORD)(sizeof(abySDOValue)), (EC_T_DWORD)(((pMbxGetEntryDescTfer->MbxData.CoE_EntryDesc.wBitLen)+7)/8) ),
                    &dwUploadBytes, dwTimeout, 0
                                      );
                if (EC_E_SLAVE_NOT_PRESENT == dwRes)
                {
                    dwRetVal = dwRes;
                    goto Exit;
                }
                else if (EC_E_NOERROR != dwRes)
                {
                    /* Upload error */
                    CRODLError("CoeReadObjectDictionary: Error in ecatCoeSdoUpload: %s (0x%lx)", ecatGetText(dwRes), dwRes);
                    dwRetVal = dwRes;
                    continue;
                }

                if (((OBJCODE_REC == pMbxGetObDescTfer->MbxData.CoE_ObDesc.byObjCode) && (0 == wSubIndex))
                 || ((OBJCODE_ARR == pMbxGetObDescTfer->MbxData.CoE_ObDesc.byObjCode) && (0 == wSubIndex)))
                {
                    wSubIndexLimit = (EC_T_BYTE)(((EC_T_WORD) abySDOValue[0]) + 1);
                }

                if (nVerbosePrinting > 1)
                {
                    switch (pMbxGetEntryDescTfer->MbxData.CoE_EntryDesc.wDataType)
                    {
                    case DEFTYPE_BOOLEAN:
                    case DEFTYPE_BIT1:
                    case DEFTYPE_BIT2:
                    case DEFTYPE_BIT3:
                    case DEFTYPE_BIT4:
                    case DEFTYPE_BIT5:
                    case DEFTYPE_BIT6:
                    case DEFTYPE_BIT7:
                    case DEFTYPE_BIT8:
                    case DEFTYPE_INTEGER8:
                    case DEFTYPE_UNSIGNED8:
                        {
                            CRODLMsg("%04x:%d BYTE: 0x%02X",
                                pwODList[wIndex], EC_LOBYTE(wSubIndex), abySDOValue[0]
                                  );
                        } break;
                    case DEFTYPE_INTEGER16:
                        {
                            CRODLMsg("%04x:%d SI16: %04d",
                                pwODList[wIndex], EC_LOBYTE(wSubIndex), EC_NTOHS(EC_GETWORD(&abySDOValue[0]))
                                );
                        } break;
                    case DEFTYPE_UNSIGNED16:
                        {
                            CRODLMsg("%04x:%d WORD: 0x%04X",
                                pwODList[wIndex], EC_LOBYTE(wSubIndex), EC_NTOHS(EC_GETWORD(&abySDOValue[0]))
                                  );
                        } break;
                    case DEFTYPE_INTEGER32:
                        {
                            CRODLMsg("%04x:%d SI32: %08ld",
                                pwODList[wIndex], EC_LOBYTE(wSubIndex), EC_NTOHL(EC_GETDWORD(&abySDOValue[0]))
                                );
                        } break;
                    case DEFTYPE_UNSIGNED32:
                        {
                            CRODLMsg("%04x:%d DWRD: 0x%08lX",
                                pwODList[wIndex], EC_LOBYTE(wSubIndex), EC_NTOHL(EC_GETDWORD(&abySDOValue[0]))
                                  );
                        } break;
                    case DEFTYPE_VISIBLESTRING:
                        {
                            CRODLMsg("%04x:%d STRG: %s",
                                pwODList[wIndex], EC_LOBYTE(wSubIndex), (EC_T_CHAR*)abySDOValue
                                  );
                        } break;
                    case DEFTYPE_OCTETSTRING:
                        {
#if (defined INCLUDE_MASTER_OBD)
                            if( (COEOBJID_HISTORY_OBJECT == (pwODList[wIndex])) && EC_LOBYTE(wSubIndex) > 5 )
                            {
                                /* Diag Entry */
                                EC_T_OBJ10F3_DIAGMSG*   pDiag = (EC_T_OBJ10F3_DIAGMSG*)abySDOValue;
                                CRODLMsg("%04x:%d DIAG # 0x%lx type <%s> Text 0x%x Time: 0x%x.%x",
                                    pwODList[wIndex], EC_LOBYTE(wSubIndex),
                                    pDiag->dwDiagNumber,
                                    (((pDiag->wFlags&0x0F)==DIAGFLAGERROR)?"ERR":(((pDiag->wFlags&0x0F)==DIAGFLAGWARN)?"WARN":(((pDiag->wFlags&0x0F)==DIAGFLAGINFO)?"INF":"UNK"))),
                                    pDiag->wTextId,
#ifdef  __TMS470__
                                    pDiag->dwTimeStampHi, pDiag->dwTimeStampLo
#else
                                    EC_HIDWORD(pDiag->qwTimeStamp), EC_LODWORD(pDiag->qwTimeStamp)
#endif
                                      );
                                ParseDiagMsg(poLog, pDiag);
                            }
                            else
#endif
                            {
                                CRODLMsg("%04x:%d OCTS: %s",
                                    pwODList[wIndex], EC_LOBYTE(wSubIndex), (EC_T_CHAR*)abySDOValue
                                    );
                            }
                        } break;
                    case DEFTYPE_UNSIGNED48:
                        {
                            CRODLMsg("%04x:%d US48: %02X:%02X:%02X:%02X:%02X:%02X",
                                pwODList[wIndex], EC_LOBYTE(wSubIndex),
                                abySDOValue[0],
                                abySDOValue[1],
                                abySDOValue[2],
                                abySDOValue[3],
                                abySDOValue[4],
                                abySDOValue[5]
                                    );
                        } break;
                    case DEFTYPE_UNSIGNED64:
                        {
                            CRODLMsg("%04x:%d QWRD: 0x%08lX.%08lX",
                                pwODList[wIndex], EC_LOBYTE(wSubIndex),
                                EC_HIDWORD(EC_NTOHLL(EC_GETQWORD(&abySDOValue[0]))),
                                EC_LODWORD(EC_NTOHLL(EC_GETQWORD(&abySDOValue[0])))
                                  );
                        } break;
                    default:
                        {
                            EC_T_DWORD  dwIdx = 0;

                            CRODLMsg("%04x:%d DFLT: ", pwODList[wIndex], EC_LOBYTE(wSubIndex));
                            for (dwIdx = 0; dwIdx < dwUploadBytes; dwIdx++)
                            {
                                CRODLMsgAdd("%02x ", abySDOValue[dwIdx]);
                                if ((0 != dwIdx) && (0 == (dwIdx%8)))
                                {
                                    CRODLMsgAdd(" ");
                                }
                                if ((0 != dwIdx) && (0 == (dwIdx%32)))
                                {
                                    CRODLMsgAdd("\n");
                                }
                            }
                            CRODLMsg("");
                        } break;
                    } /* switch (pMbxGetEntryDescTfer->MbxData.CoE_EntryDesc.wDataType) */

#if (defined INCLUDE_MASTER_OBD)
                    if (COEOBJID_SLAVECFGINFOBASE <= pwODList[wIndex] && 1 == EC_LOBYTE(wSubIndex))
                    {
                        EC_T_BOOL bEntryValid   = EC_FALSE;
                        bEntryValid = EC_NTOHL(EC_GETDWORD(abySDOValue));

                        /* do not show unused Slave Entries */
                        if (!bEntryValid)
                        {
                            break;
                        }
                    }
#endif
                    /* give logging task a chance to flush */
                    if (bReadingMasterOD)
                        OsSleep(2);
                } /* nVerbosePrinting > 1 */
            } /* bPerformUpload */

            /* MbxGetObDescTfer done */
            pMbxGetObDescTfer->eTferStatus = eMbxTferStatus_Idle;
        } /* for (wSubIndex = 0; (wSubIndex < wSubIndexLimit) && (EC_E_NOERROR == dwRetVal); wSubIndex++) */
    } /* for (wIndex = 0; (wIndex < wODListLen) && (EC_E_NOERROR == dwRetVal) && !*pbStopReading; wIndex++) */

    dwRetVal = EC_E_NOERROR;
Exit:
    /* Delete MBX Transfer objects */
    if (EC_NULL != pMbxGetODLTfer)
    {
        emMbxTferDelete(dwInstanceID, pMbxGetODLTfer);
        pMbxGetODLTfer = EC_NULL;
    }
    if (EC_NULL != pMbxGetObDescTfer)
    {
        emMbxTferDelete(dwInstanceID, pMbxGetObDescTfer);
        pMbxGetObDescTfer = EC_NULL;
    }
    if (EC_NULL != pMbxGetEntryDescTfer)
    {
        emMbxTferDelete(dwInstanceID, pMbxGetEntryDescTfer);
        pMbxGetEntryDescTfer = EC_NULL;
    }

    /* Free allocated memory */
    SafeOsFree(pwODList);
    SafeOsFree(pbyODLTferBuffer);
    SafeOsFree(pbyOBDescTferBuffer);
    SafeOsFree(pbyGetEntryTferBuffer);

    return dwRetVal;
}